

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O1

void duckdb_fastpforlib::fastunpack(uint32_t *in,uint32_t *out,uint32_t bit)

{
  logic_error *this;
  
  switch(bit) {
  case 0:
    internal::__fastunpack0(in,out);
    return;
  case 1:
    internal::__fastunpack1(in,out);
    return;
  case 2:
    internal::__fastunpack2(in,out);
    return;
  case 3:
    internal::__fastunpack3(in,out);
    return;
  case 4:
    internal::__fastunpack4(in,out);
    return;
  case 5:
    internal::__fastunpack5(in,out);
    return;
  case 6:
    internal::__fastunpack6(in,out);
    return;
  case 7:
    internal::__fastunpack7(in,out);
    return;
  case 8:
    internal::__fastunpack8(in,out);
    return;
  case 9:
    internal::__fastunpack9(in,out);
    return;
  case 10:
    internal::__fastunpack10(in,out);
    return;
  case 0xb:
    internal::__fastunpack11(in,out);
    return;
  case 0xc:
    internal::__fastunpack12(in,out);
    return;
  case 0xd:
    internal::__fastunpack13(in,out);
    return;
  case 0xe:
    internal::__fastunpack14(in,out);
    return;
  case 0xf:
    internal::__fastunpack15(in,out);
    return;
  case 0x10:
    internal::__fastunpack16(in,out);
    return;
  case 0x11:
    internal::__fastunpack17(in,out);
    return;
  case 0x12:
    internal::__fastunpack18(in,out);
    return;
  case 0x13:
    internal::__fastunpack19(in,out);
    return;
  case 0x14:
    internal::__fastunpack20(in,out);
    return;
  case 0x15:
    internal::__fastunpack21(in,out);
    return;
  case 0x16:
    internal::__fastunpack22(in,out);
    return;
  case 0x17:
    internal::__fastunpack23(in,out);
    return;
  case 0x18:
    internal::__fastunpack24(in,out);
    return;
  case 0x19:
    internal::__fastunpack25(in,out);
    return;
  case 0x1a:
    internal::__fastunpack26(in,out);
    return;
  case 0x1b:
    internal::__fastunpack27(in,out);
    return;
  case 0x1c:
    internal::__fastunpack28(in,out);
    return;
  case 0x1d:
    internal::__fastunpack29(in,out);
    return;
  case 0x1e:
    internal::__fastunpack30(in,out);
    return;
  case 0x1f:
    internal::__fastunpack31(in,out);
    return;
  case 0x20:
    internal::__fastunpack32(in,out);
    return;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid bit width for bitpacking");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

inline void fastunpack(const uint32_t *__restrict in,
                       uint32_t *__restrict out, const uint32_t bit) {
  // Could have used function pointers instead of switch.
  // Switch calls do offer the compiler more opportunities for optimization in
  // theory. In this case, it makes no difference with a good compiler.
  switch (bit) {
  case 0:
    internal::__fastunpack0(in, out);
    break;
  case 1:
    internal::__fastunpack1(in, out);
    break;
  case 2:
    internal::__fastunpack2(in, out);
    break;
  case 3:
    internal::__fastunpack3(in, out);
    break;
  case 4:
    internal::__fastunpack4(in, out);
    break;
  case 5:
    internal::__fastunpack5(in, out);
    break;
  case 6:
    internal::__fastunpack6(in, out);
    break;
  case 7:
    internal::__fastunpack7(in, out);
    break;
  case 8:
    internal::__fastunpack8(in, out);
    break;
  case 9:
    internal::__fastunpack9(in, out);
    break;
  case 10:
    internal::__fastunpack10(in, out);
    break;
  case 11:
    internal::__fastunpack11(in, out);
    break;
  case 12:
    internal::__fastunpack12(in, out);
    break;
  case 13:
    internal::__fastunpack13(in, out);
    break;
  case 14:
    internal::__fastunpack14(in, out);
    break;
  case 15:
    internal::__fastunpack15(in, out);
    break;
  case 16:
    internal::__fastunpack16(in, out);
    break;
  case 17:
    internal::__fastunpack17(in, out);
    break;
  case 18:
    internal::__fastunpack18(in, out);
    break;
  case 19:
    internal::__fastunpack19(in, out);
    break;
  case 20:
    internal::__fastunpack20(in, out);
    break;
  case 21:
    internal::__fastunpack21(in, out);
    break;
  case 22:
    internal::__fastunpack22(in, out);
    break;
  case 23:
    internal::__fastunpack23(in, out);
    break;
  case 24:
    internal::__fastunpack24(in, out);
    break;
  case 25:
    internal::__fastunpack25(in, out);
    break;
  case 26:
    internal::__fastunpack26(in, out);
    break;
  case 27:
    internal::__fastunpack27(in, out);
    break;
  case 28:
    internal::__fastunpack28(in, out);
    break;
  case 29:
    internal::__fastunpack29(in, out);
    break;
  case 30:
    internal::__fastunpack30(in, out);
    break;
  case 31:
    internal::__fastunpack31(in, out);
    break;
  case 32:
    internal::__fastunpack32(in, out);
    break;
  default:
    throw std::logic_error("Invalid bit width for bitpacking");
  }
}